

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindFileInFallbackDatabase
          (DescriptorPool *this,StringPiece name)

{
  uint uVar1;
  pointer pTVar2;
  size_type sVar3;
  FileDescriptor *pFVar4;
  undefined1 local_130 [8];
  FileDescriptorProto file_proto;
  undefined1 local_48 [8];
  string name_string;
  DescriptorPool *this_local;
  StringPiece name_local;
  
  name_local.ptr_ = (char *)name.length_;
  this_local = (DescriptorPool *)name.ptr_;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    name_local.length_._7_1_ = 0;
  }
  else {
    name_string.field_2._8_8_ = this;
    stringpiece_internal::StringPiece::operator_cast_to_string
              ((string *)local_48,(StringPiece *)&this_local);
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    sVar3 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pTVar2->known_bad_files_,(string *)local_48);
    if (sVar3 == 0) {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_130);
      uVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[2])
                        (this->fallback_database_,local_48,local_130);
      if (((uVar1 & 1) == 0) ||
         (pFVar4 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_130),
         pFVar4 == (FileDescriptor *)0x0)) {
        pTVar2 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&pTVar2->known_bad_files_,(value_type *)local_48);
        name_local.length_._7_1_ = 0;
      }
      else {
        name_local.length_._7_1_ = 1;
      }
      file_proto.source_code_info_._0_4_ = 1;
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_130);
    }
    else {
      name_local.length_._7_1_ = 0;
      file_proto.source_code_info_._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return (bool)(name_local.length_._7_1_ & 1);
}

Assistant:

bool DescriptorPool::TryFindFileInFallbackDatabase(
    StringPiece name) const {
  if (fallback_database_ == nullptr) return false;

  auto name_string = std::string(name);
  if (tables_->known_bad_files_.count(name_string) > 0) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileByName(name_string, &file_proto) ||
      BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_files_.insert(std::move(name_string));
    return false;
  }
  return true;
}